

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void internal_counters_mgga_next
               (xc_dimensions *dim,int offset,double **rho,double **sigma,long *lapl,long *tau,
               double **zk,double **vrho,double **vsigma,long *vlapl,long *vtau,double **v2rho2,
               double **v2rhosigma,long *v2rholapl,long *v2rhotau,double **v2sigma2,
               long *v2sigmalapl,long *v2sigmatau,long *v2lapl2,long *v2lapltau,long *v2tau2)

{
  long lVar1;
  double **in_stack_ffffffffffffff78;
  double **in_stack_ffffffffffffff80;
  double **in_stack_ffffffffffffff88;
  double **in_stack_ffffffffffffff90;
  double **in_stack_ffffffffffffff98;
  double **in_stack_ffffffffffffffa0;
  double **in_stack_ffffffffffffffa8;
  double **in_stack_ffffffffffffffb0;
  double **in_stack_ffffffffffffffb8;
  
  internal_counters_gga_next
            (dim,offset,rho,sigma,zk,vrho,vsigma,v2rho2,v2rhosigma,v2sigma2,
             in_stack_ffffffffffffff78,in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffffa8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffb8);
  lVar1 = (long)offset;
  if (*lapl != 0) {
    *lapl = *lapl + (dim->lapl + lVar1) * 8;
  }
  if (*tau != 0) {
    *tau = *tau + (dim->tau + lVar1) * 8;
  }
  if (*vrho != (double *)0x0) {
    if (*vlapl != 0) {
      *vlapl = *vlapl + (dim->vlapl + lVar1) * 8;
    }
    if (*vtau != 0) {
      *vtau = *vtau + (dim->vtau + lVar1) * 8;
    }
  }
  if (*v2rho2 != (double *)0x0) {
    if (*v2lapl2 != 0) {
      *v2rholapl = *v2rholapl + (dim->v2rholapl + lVar1) * 8;
      *v2sigmalapl = *v2sigmalapl + (dim->v2sigmalapl + lVar1) * 8;
      *v2lapl2 = *v2lapl2 + (dim->v2lapl2 + lVar1) * 8;
    }
    if (*v2tau2 != 0) {
      *v2rhotau = *v2rhotau + (dim->v2rhotau + lVar1) * 8;
      *v2sigmatau = *v2sigmatau + (dim->v2sigmatau + lVar1) * 8;
      *v2tau2 = *v2tau2 + (dim->v2tau2 + lVar1) * 8;
    }
    if (*v2lapltau != 0) {
      *v2lapltau = *v2lapltau + (dim->v2lapltau + lVar1) * 8;
    }
  }
  return;
}

Assistant:

GPU_FUNCTION void
internal_counters_mgga_next
  (const xc_dimensions *dim, int offset,
   const double **rho, const double **sigma, const double **lapl, const double **tau,
   double **zk MGGA_OUT_PARAMS_NO_EXC(XC_COMMA double **, ))
{
  internal_counters_gga_next(dim, offset, rho, sigma, zk GGA_OUT_PARAMS_NO_EXC(XC_COMMA, ));

  if(*lapl != NULL) *lapl += dim->lapl + offset;
  if(*tau != NULL)  *tau  += dim->tau  + offset;

#ifndef XC_DONT_COMPILE_VXC
  if(*vrho != NULL) {
    if (*vlapl != NULL)
      *vlapl += dim->vlapl + offset;
    if (*vtau != NULL)
      *vtau  += dim->vtau  + offset;
  }

#ifndef XC_DONT_COMPILE_FXC
  if(*v2rho2 != NULL) {
    if (*v2lapl2 != NULL){
      *v2rholapl   += dim->v2rholapl   + offset;
      *v2sigmalapl += dim->v2sigmalapl + offset;
      *v2lapl2     += dim->v2lapl2     + offset;
    }
    if (*v2tau2 != NULL){
      *v2rhotau    += dim->v2rhotau    + offset;
      *v2sigmatau  += dim->v2sigmatau  + offset;
      *v2tau2      += dim->v2tau2      + offset;
    }
    if (*v2lapltau != NULL){
      *v2lapltau   += dim->v2lapltau   + offset;
    }
  }

#ifndef XC_DONT_COMPILE_KXC
  if(*v3rho3 != NULL) {
    if (*v3lapl3 != NULL){
      *v3rho2lapl     += dim->v3rho2lapl     + offset;
      *v3rhosigmalapl += dim->v3rhosigmalapl + offset;
      *v3rholapl2     += dim->v3rholapl2     + offset;
      *v3sigma2lapl   += dim->v3sigma2lapl   + offset;
      *v3sigmalapl2   += dim->v3sigmalapl2   + offset;
      *v3lapl3        += dim->v3lapl3        + offset;
    }
    if (*v3tau3 != NULL){
      *v3rho2tau      += dim->v3rho2tau      + offset;
      *v3rhosigmatau  += dim->v3rhosigmatau  + offset;
      *v3rhotau2      += dim->v3rhotau2      + offset;
      *v3sigma2tau    += dim->v3sigma2tau    + offset;
      *v3sigmatau2    += dim->v3sigmatau2    + offset;
      *v3tau3         += dim->v3tau3         + offset;
    }
    if(*v3rholapltau != NULL){
      *v3rholapltau   += dim->v3rholapltau   + offset;
      *v3sigmalapltau += dim->v3sigmalapltau + offset;
      *v3lapl2tau     += dim->v3lapl2tau     + offset;
      *v3lapltau2     += dim->v3lapltau2     + offset;
    }
  }
#ifndef XC_DONT_COMPILE_LXC
  if(*v4rho4 != NULL) {
    if (*v4lapl4 != NULL){
      *v4rho3lapl        += dim->v4rho3lapl        + offset;
      *v4rho2sigmalapl   += dim->v4rho2sigmalapl   + offset;
      *v4rho2lapl2       += dim->v4rho2lapl2       + offset;
      *v4rhosigma2lapl   += dim->v4rhosigma2lapl   + offset;
      *v4rhosigmalapl2   += dim->v4rhosigmalapl2   + offset;
      *v4rholapl3        += dim->v4rholapl3        + offset;
      *v4sigma3lapl      += dim->v4sigma3lapl      + offset;
      *v4sigma2lapl2     += dim->v4sigma2lapl2     + offset;
      *v4sigmalapl3      += dim->v4sigmalapl3      + offset;
      *v4lapl4           += dim->v4lapl4           + offset;
    }
    if (*v4tau4 != NULL){
      *v4rho3tau         += dim->v4rho3tau         + offset;
      *v4rho2sigmatau    += dim->v4rho2sigmatau    + offset;
      *v4rho2tau2        += dim->v4rho2tau2        + offset;
      *v4rhosigma2tau    += dim->v4rhosigma2tau    + offset;
      *v4rhosigmatau2    += dim->v4rhosigmatau2    + offset;
      *v4rhotau3         += dim->v4rhotau3         + offset;
      *v4sigma3tau       += dim->v4sigma3tau       + offset;
      *v4sigma2tau2      += dim->v4sigma2tau2      + offset;
      *v4sigmatau3       += dim->v4sigmatau3       + offset;
      *v4tau4            += dim->v4tau4            + offset;
    }
    if(*v4rho2lapltau != NULL){
      *v4rho2lapltau     += dim->v4rho2lapltau     + offset;
      *v4rhosigmalapltau += dim->v4rhosigmalapltau + offset;
      *v4rholapl2tau     += dim->v4rholapl2tau     + offset;
      *v4rholapltau2     += dim->v4rholapltau2     + offset;
      *v4sigma2lapltau   += dim->v4sigma2lapltau   + offset;
      *v4sigmalapl2tau   += dim->v4sigmalapl2tau   + offset;
      *v4sigmalapltau2   += dim->v4sigmalapltau2   + offset;
      *v4lapl3tau        += dim->v4lapl3tau        + offset;
      *v4lapl2tau2       += dim->v4lapl2tau2       + offset;
      *v4lapltau3        += dim->v4lapltau3        + offset;
    }
  }
#endif
#endif
#endif
#endif
}